

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O0

PtexTexture * __thiscall
Ptex::v2_4::PtexReaderCache::get(PtexReaderCache *this,char *filename,String *error)

{
  bool bVar1;
  undefined1 uVar2;
  PtexCachedReader *pPVar3;
  PtexCachedReader *errorHandler;
  int in_EDX;
  __pthread_internal_list *in_RSI;
  StringKey *in_RDI;
  String *in_stack_00000010;
  string *in_stack_00000018;
  char **in_stack_00000020;
  PtexReaderCache *in_stack_00000028;
  PtexCachedReader *newreader;
  size_t newMemUsed;
  char *pathToOpen;
  string buffer;
  bool needOpen;
  bool isNew;
  PtexCachedReader *reader;
  StringKey key;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  PtexCachedReader *in_stack_ffffffffffffff30;
  PtexCachedReader *in_stack_ffffffffffffff38;
  undefined6 in_stack_ffffffffffffff40;
  undefined1 in_stack_ffffffffffffff46;
  undefined1 in_stack_ffffffffffffff47;
  undefined6 in_stack_ffffffffffffff50;
  undefined1 in_stack_ffffffffffffff56;
  undefined1 in_stack_ffffffffffffff57;
  PtexCachedReader *pPVar4;
  string local_78 [35];
  byte local_55;
  undefined4 local_54;
  byte local_4d;
  PtexCachedReader *local_40;
  undefined4 local_20;
  undefined8 local_18;
  PtexInputHandler local_8;
  
  pPVar4 = (PtexCachedReader *)&stack0xffffffffffffffc8;
  local_18 = in_RSI;
  local_20 = in_EDX;
  StringKey::StringKey
            ((StringKey *)in_stack_ffffffffffffff30,
             (char *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
  pPVar3 = PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::get
                     ((PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *)pPVar4,
                      in_RDI);
  local_4d = 0;
  local_40 = pPVar3;
  if (pPVar3 == (PtexCachedReader *)0x0) {
    errorHandler = (PtexCachedReader *)operator_new(0x310);
    PtexCachedReader::PtexCachedReader
              (pPVar4,SUB81((ulong)in_RDI >> 0x38,0),
               (PtexInputHandler *)
               CONCAT17(in_stack_ffffffffffffff57,
                        CONCAT16(in_stack_ffffffffffffff56,in_stack_ffffffffffffff50)),
               (PtexErrorHandler *)errorHandler,
               (PtexReaderCache *)
               CONCAT17(in_stack_ffffffffffffff47,
                        CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)));
    local_4d = 1;
    local_40 = errorHandler;
  }
  else {
    bVar1 = PtexReader::ok(&pPVar3->super_PtexReader);
    if (!bVar1) {
      local_8._vptr_PtexInputHandler = (_func_int **)0x0;
      goto LAB_0010735b;
    }
    bVar1 = PtexReader::pendingPurge(&local_40->super_PtexReader);
    if (bVar1) {
      purge((PtexReaderCache *)
            CONCAT17(in_stack_ffffffffffffff47,
                     CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
            in_stack_ffffffffffffff38);
    }
    PtexCachedReader::ref(local_40);
  }
  uVar2 = PtexReader::needToOpen(&local_40->super_PtexReader);
  local_55 = uVar2;
  if ((bool)uVar2) {
    std::__cxx11::string::string(local_78);
    if ((in_RDI[1]._val != (char *)0x0) ||
       (in_stack_ffffffffffffff46 =
             findFile(in_stack_00000028,in_stack_00000020,in_stack_00000018,in_stack_00000010),
       (bool)in_stack_ffffffffffffff46)) {
      PtexReader::open(&local_40->super_PtexReader,(char *)local_18,local_20);
    }
    else {
      PtexReader::invalidate(&local_40->super_PtexReader);
    }
    std::__cxx11::string::~string(local_78);
  }
  if ((local_4d & 1) != 0) {
    pPVar3 = PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*>::tryInsert
                       ((PtexHashMap<Ptex::v2_4::StringKey,_Ptex::v2_4::PtexCachedReader_*> *)
                        local_40,(StringKey *)pPVar3,pPVar4,(size_t *)in_RDI);
    pPVar4 = local_40;
    local_40 = pPVar3;
    adjustMemUsed((PtexReaderCache *)
                  CONCAT17(uVar2,CONCAT16(in_stack_ffffffffffffff46,in_stack_ffffffffffffff40)),
                  (size_t)pPVar3);
    if ((local_40 != pPVar4) &&
       (in_stack_ffffffffffffff30 = pPVar4, PtexCachedReader::ref(local_40),
       in_stack_ffffffffffffff30 != (PtexCachedReader *)0x0)) {
      (*(in_stack_ffffffffffffff30->super_PtexReader).super_PtexTexture._vptr_PtexTexture[1])();
    }
  }
  bVar1 = PtexReader::ok(&local_40->super_PtexReader);
  if (bVar1) {
    if ((local_55 & 1) != 0) {
      PtexReader::logOpen(&local_40->super_PtexReader);
    }
    local_8._vptr_PtexInputHandler = (_func_int **)local_40;
  }
  else {
    PtexCachedReader::unref(local_40);
    local_8._vptr_PtexInputHandler = (_func_int **)0x0;
  }
LAB_0010735b:
  local_54 = 1;
  StringKey::~StringKey((StringKey *)in_stack_ffffffffffffff30);
  return (PtexTexture *)(PtexCachedReader *)local_8._vptr_PtexInputHandler;
}

Assistant:

PtexTexture* PtexReaderCache::get(const char* filename, Ptex::String& error)
{
    // lookup reader in map
    StringKey key(filename);
    PtexCachedReader* reader = _files.get(key);
    bool isNew = false;

    if (reader) {
        if (!reader->ok()) return 0;
        if (reader->pendingPurge()) {
            // a previous purge attempt was made and file was busy.  Try again now.
            purge(reader);
        }
        reader->ref();
    } else {
        reader = new PtexCachedReader(_premultiply, _io, _err, this);
        isNew = true;
    }

    bool needOpen = reader->needToOpen();
    if (needOpen) {
        std::string buffer;
        const char* pathToOpen = filename;
        // search for the file (unless we have an I/O handler)
        if (_io || findFile(pathToOpen, buffer, error)) {
            reader->open(pathToOpen, error);
        } else {
            // flag reader as invalid so we don't try to open it again on next lookup
            reader->invalidate();
        }
    }

    if (isNew) {
        size_t newMemUsed = 0;
        PtexCachedReader* newreader = reader;
        reader = _files.tryInsert(key, reader, newMemUsed);
        adjustMemUsed(newMemUsed);
        if (reader != newreader) {
            // another thread got here first
            reader->ref();
            delete newreader;
        }
    }

    if (!reader->ok()) {
        reader->unref();
        return 0;
    }

    if (needOpen) {
        reader->logOpen();
    }

    return reader;
}